

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O3

void google::protobuf::compiler::cpp::anon_unknown_3::SetStringVariables
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Options *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  Descriptor *descriptor_00;
  Type TVar5;
  mapped_type *pmVar6;
  long *plVar7;
  size_type *psVar8;
  long *plVar9;
  FieldDescriptor *field;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  unsigned_long extraout_RDX_01;
  unsigned_long i;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *field_00;
  char *pcVar10;
  string default_variable_string;
  key_type local_130;
  string local_110;
  key_type local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  key_type local_90;
  key_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  SetCommonFieldVariables(descriptor,variables,options);
  DefaultValue_abi_cxx11_(&local_110,(cpp *)descriptor,field);
  paVar1 = &local_130.field_2;
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"default","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_130);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_110);
  i = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    i = extraout_RDX_00;
  }
  paVar2 = &local_110.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    i = extraout_RDX_01;
  }
  SimpleItoa_abi_cxx11_(&local_110,*(protobuf **)(*(long *)(descriptor + 0xa0) + 8),i);
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"default_length","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_130);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_110);
  field_00 = extraout_RDX_02;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    field_00 = extraout_RDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    field_00 = extraout_RDX_04;
  }
  FieldName_abi_cxx11_(&local_d0,(cpp *)descriptor,field_00);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x363273);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_130.field_2._M_allocated_capacity = *psVar8;
    local_130.field_2._8_8_ = plVar7[3];
    local_130._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar8;
    local_130._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_130._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_130);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_110.field_2._M_allocated_capacity = *psVar8;
    local_110.field_2._8_8_ = plVar7[3];
    local_110._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar8;
    local_110._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_110._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"default_variable_name","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_130);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  lVar4 = *(long *)(*(long *)(descriptor + 0xa0) + 8);
  if (lVar4 == 0) {
    local_130._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"&::google::protobuf::internal::GetEmptyStringAlreadyInited()",
               "");
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"classname","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_70);
    std::operator+(&local_50,"&",pmVar6);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = &local_a0;
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_a0 = *plVar9;
      lStack_98 = plVar7[3];
    }
    else {
      local_a0 = *plVar9;
      local_b0 = (long *)*plVar7;
    }
    local_a8 = plVar7[1];
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b0,(ulong)local_110._M_dataplus._M_p);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_d0.field_2._M_allocated_capacity = *psVar8;
      local_d0.field_2._8_8_ = plVar7[3];
      local_d0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar8;
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130.field_2._8_8_ = plVar7[3];
      local_130._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_130._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
  }
  paVar3 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"default_variable","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_f0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (lVar4 != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  TVar5 = FieldDescriptor::type(descriptor);
  pcVar10 = "char";
  if (TVar5 == TYPE_BYTES) {
    pcVar10 = "void";
  }
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"pointer_type","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_130);
  std::__cxx11::string::_M_replace((ulong)pmVar6,0,(char *)pmVar6->_M_string_length,(ulong)pcVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"null_check","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_130);
  std::__cxx11::string::_M_replace((ulong)pmVar6,0,(char *)pmVar6->_M_string_length,0x3817ec);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  descriptor_00 = *(Descriptor **)(descriptor + 0x58);
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"release_","");
  SafeFunctionName(&local_130,descriptor_00,descriptor,&local_f0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"release_name","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_90);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"full_name","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_130);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"string_piece","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_130);
  std::__cxx11::string::_M_replace((ulong)pmVar6,0,(char *)pmVar6->_M_string_length,0x34fa13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SetStringVariables(const FieldDescriptor* descriptor,
                        std::map<string, string>* variables,
                        const Options& options) {
  SetCommonFieldVariables(descriptor, variables, options);
  (*variables)["default"] = DefaultValue(descriptor);
  (*variables)["default_length"] =
      SimpleItoa(descriptor->default_value_string().length());
  string default_variable_string = "_default_" + FieldName(descriptor) + "_";
  (*variables)["default_variable_name"] = default_variable_string;
  (*variables)["default_variable"] =
      descriptor->default_value_string().empty()
          ? "&::google::protobuf::internal::GetEmptyStringAlreadyInited()"
          : "&" + (*variables)["classname"] + "::" + default_variable_string +
                ".get()";
  (*variables)["pointer_type"] =
      descriptor->type() == FieldDescriptor::TYPE_BYTES ? "void" : "char";
  (*variables)["null_check"] = "GOOGLE_DCHECK(value != NULL);\n";
  // NOTE: Escaped here to unblock proto1->proto2 migration.
  // TODO(liujisi): Extend this to apply for other conflicting methods.
  (*variables)["release_name"] =
      SafeFunctionName(descriptor->containing_type(),
                       descriptor, "release_");
  (*variables)["full_name"] = descriptor->full_name();

  (*variables)["string_piece"] = "::std::string";
}